

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O3

int mbedtls_ssl_cache_set(void *data,mbedtls_ssl_session *session)

{
  int iVar1;
  mbedtls_x509_crt *pmVar2;
  size_t __size;
  int iVar3;
  time_t tVar4;
  long *plVar5;
  long *plVar6;
  void *__dest;
  int iVar7;
  long *plVar8;
  long lVar9;
  
  iVar7 = 0;
  tVar4 = time((time_t *)0x0);
  if (*data == (long *)0x0) {
    if (*(int *)((long)data + 0xc) < 1) {
      return 1;
    }
    plVar6 = (long *)calloc(1,0xc0);
    if (plVar6 == (long *)0x0) {
      return 1;
    }
    *(long **)data = plVar6;
  }
  else {
    iVar1 = *(int *)((long)data + 8);
    plVar8 = (long *)0x0;
    lVar9 = 0;
    plVar5 = *data;
    do {
      plVar6 = plVar5;
      if ((iVar1 != 0) && (iVar1 < (int)tVar4 - (int)*plVar6)) goto LAB_001150cc;
      iVar3 = bcmp(session->id,plVar6 + 4,plVar6[3]);
      if (iVar3 == 0) goto LAB_001150d8;
      if (*plVar6 < lVar9 || lVar9 == 0) {
        plVar8 = plVar6;
        lVar9 = *plVar6;
      }
      iVar7 = iVar7 + 1;
      plVar5 = (long *)plVar6[0x17];
    } while ((long *)plVar6[0x17] != (long *)0x0);
    if (iVar7 < *(int *)((long)data + 0xc)) {
      plVar5 = (long *)calloc(1,0xc0);
      if (plVar5 == (long *)0x0) {
        return 1;
      }
      plVar6[0x17] = (long)plVar5;
      plVar6 = plVar5;
    }
    else {
      plVar6 = plVar8;
      if (plVar8 == (long *)0x0) {
        return 1;
      }
    }
  }
LAB_001150cc:
  *plVar6 = tVar4;
LAB_001150d8:
  memcpy(plVar6 + 1,session,0x98);
  if ((void *)plVar6[0x16] != (void *)0x0) {
    free((void *)plVar6[0x16]);
    plVar6[0x14] = 0;
    plVar6[0x15] = 0;
    plVar6[0x16] = 0;
  }
  pmVar2 = session->peer_cert;
  if (pmVar2 != (mbedtls_x509_crt *)0x0) {
    __size = (pmVar2->raw).len;
    __dest = calloc(1,__size);
    plVar6[0x16] = (long)__dest;
    if (__dest == (void *)0x0) {
      return 1;
    }
    memcpy(__dest,(pmVar2->raw).p,__size);
    plVar6[0x15] = __size;
    plVar6[0xe] = 0;
    return 0;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_cache_set( void *data, const mbedtls_ssl_session *session )
{
    int ret = 1;
#if defined(MBEDTLS_HAVE_TIME)
    mbedtls_time_t t = mbedtls_time( NULL ), oldest = 0;
    mbedtls_ssl_cache_entry *old = NULL;
#endif
    mbedtls_ssl_cache_context *cache = (mbedtls_ssl_cache_context *) data;
    mbedtls_ssl_cache_entry *cur, *prv;
    int count = 0;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &cache->mutex ) ) != 0 )
        return( ret );
#endif

    cur = cache->chain;
    prv = NULL;

    while( cur != NULL )
    {
        count++;

#if defined(MBEDTLS_HAVE_TIME)
        if( cache->timeout != 0 &&
            (int) ( t - cur->timestamp ) > cache->timeout )
        {
            cur->timestamp = t;
            break; /* expired, reuse this slot, update timestamp */
        }
#endif

        if( memcmp( session->id, cur->session.id, cur->session.id_len ) == 0 )
            break; /* client reconnected, keep timestamp for session id */

#if defined(MBEDTLS_HAVE_TIME)
        if( oldest == 0 || cur->timestamp < oldest )
        {
            oldest = cur->timestamp;
            old = cur;
        }
#endif

        prv = cur;
        cur = cur->next;
    }

    if( cur == NULL )
    {
#if defined(MBEDTLS_HAVE_TIME)
        /*
         * Reuse oldest entry if max_entries reached
         */
        if( count >= cache->max_entries )
        {
            if( old == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = old;
        }
#else /* MBEDTLS_HAVE_TIME */
        /*
         * Reuse first entry in chain if max_entries reached,
         * but move to last place
         */
        if( count >= cache->max_entries )
        {
            if( cache->chain == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = cache->chain;
            cache->chain = cur->next;
            cur->next = NULL;
            prv->next = cur;
        }
#endif /* MBEDTLS_HAVE_TIME */
        else
        {
            /*
             * max_entries not reached, create new entry
             */
            cur = mbedtls_calloc( 1, sizeof(mbedtls_ssl_cache_entry) );
            if( cur == NULL )
            {
                ret = 1;
                goto exit;
            }

            if( prv == NULL )
                cache->chain = cur;
            else
                prv->next = cur;
        }

#if defined(MBEDTLS_HAVE_TIME)
        cur->timestamp = t;
#endif
    }